

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O3

FuncValue * __thiscall
asmjit::v1_14::FuncDetail::arg(FuncDetail *this,size_t argIndex,size_t valueIndex)

{
  FuncDetail *pFVar1;
  uint extraout_EDX;
  byte bVar2;
  
  if (argIndex < 0x20) {
    if (valueIndex < 4) {
      return (FuncValue *)(this + valueIndex * 4 + argIndex * 0x10 + 0x9c);
    }
  }
  else {
    arg();
  }
  arg();
  if ((byte)argIndex < 4) {
    return (FuncValue *)(ulong)*(uint *)(this + (argIndex & 0xff) * 4 + 0x30);
  }
  FuncFrame::dirtyRegs();
  bVar2 = (byte)argIndex;
  if (bVar2 < 4) {
    return (FuncValue *)(ulong)*(uint *)(this + (argIndex & 0xff) * 4 + 0x40);
  }
  FuncFrame::preservedRegs();
  if (bVar2 < 4) {
    *(uint *)(this + (long)(ulong)bVar2 * 4 + 0x30) =
         *(uint *)(this + (long)(ulong)bVar2 * 4 + 0x30) | extraout_EDX;
    return (FuncValue *)(ulong)bVar2;
  }
  FuncFrame::addDirtyRegs();
  pFVar1 = (FuncDetail *)0x48;
  if ((uint)this < 0x48) {
    pFVar1 = this;
  }
  return (FuncValue *)("Ok" + DebugUtils::errorAsString::sErrorIndex[(ulong)pFVar1 & 0xffffffff]);
}

Assistant:

inline const FuncValue& arg(size_t argIndex, size_t valueIndex = 0) const noexcept {
    ASMJIT_ASSERT(argIndex < Globals::kMaxFuncArgs);
    return _args[argIndex][valueIndex];
  }